

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

bool __thiscall
FWeaponSlots::LocateWeapon(FWeaponSlots *this,PClassWeapon *type,int *slot,int *index)

{
  int iVar1;
  int local_34;
  int j;
  int i;
  int *index_local;
  int *slot_local;
  PClassWeapon *type_local;
  FWeaponSlots *this_local;
  
  local_34 = 0;
  while( true ) {
    if (9 < local_34) {
      return false;
    }
    iVar1 = FWeaponSlot::LocateWeapon(this->Slots + local_34,type);
    if (-1 < iVar1) break;
    local_34 = local_34 + 1;
  }
  if (slot != (int *)0x0) {
    *slot = local_34;
  }
  if (index != (int *)0x0) {
    *index = iVar1;
  }
  return true;
}

Assistant:

bool FWeaponSlots::LocateWeapon (PClassWeapon *type, int *const slot, int *const index)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; i++)
	{
		j = Slots[i].LocateWeapon(type);
		if (j >= 0)
		{
			if (slot != NULL) *slot = i;
			if (index != NULL) *index = j;
			return true;
		}
	}
	return false;
}